

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_add_qua_as_tri(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *qua_nodes)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  REF_INT tri_nodes [27];
  REF_GLOB qua_global [27];
  REF_INT local_168;
  REF_INT local_164;
  REF_INT local_160;
  REF_INT local_15c;
  long local_f8 [27];
  
  local_15c = qua_nodes[4];
  lVar4 = 0;
  do {
    iVar1 = qua_nodes[lVar4];
    lVar6 = -1;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar6 = ref_node->global[iVar1], lVar6 < 0)) {
      lVar6 = -1;
    }
    local_f8[lVar4] = lVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if ((local_f8[0] < local_f8[1] && local_f8[0] < local_f8[3]) ||
     (local_f8[2] < local_f8[3] && local_f8[2] < local_f8[1])) {
    local_168 = *qua_nodes;
    local_164 = qua_nodes[2];
    local_160 = qua_nodes[3];
    uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
    if (uVar2 != 0) {
      uVar5 = 0x43c;
      goto LAB_001a9fe2;
    }
    local_168 = *qua_nodes;
    local_164 = qua_nodes[1];
    local_160 = qua_nodes[2];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
    uVar2 = 0;
    if (uVar3 == 0) goto LAB_001aa043;
    uVar5 = 0x440;
    uVar2 = uVar3;
  }
  else {
    local_168 = *qua_nodes;
    local_164 = qua_nodes[1];
    local_160 = qua_nodes[3];
    uVar2 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
    if (uVar2 != 0) {
      uVar5 = 0x448;
LAB_001a9fe2:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar5
             ,"ref_shard_add_qua_as_tri",(ulong)uVar2,"a tri");
      return uVar2;
    }
    local_168 = qua_nodes[2];
    local_164 = qua_nodes[3];
    local_160 = qua_nodes[1];
    uVar3 = ref_shard_cell_add_local(ref_node,ref_cell,&local_168);
    uVar2 = 0;
    if (uVar3 == 0) goto LAB_001aa043;
    uVar5 = 0x44c;
    uVar2 = uVar3;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar5,
         "ref_shard_add_qua_as_tri",(ulong)uVar2,"a tri");
  uVar3 = uVar2;
LAB_001aa043:
  if (uVar3 != 0) {
    return uVar2;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_qua_as_tri(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *qua_nodes) {
  REF_GLOB qua_global[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];

  tri_nodes[3] = qua_nodes[4]; /* patch id */

  for (node = 0; node < 4; node++)
    qua_global[node] = ref_node_global(ref_node, qua_nodes[node]);

  if ((qua_global[0] < qua_global[1] && qua_global[0] < qua_global[3]) ||
      (qua_global[2] < qua_global[1] &&
       qua_global[2] < qua_global[3])) { /* 0-2 diag split of quad */
                                         /* 2-1
                                            |\|
                                            3-0 */
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[2];
    tri_nodes[2] = qua_nodes[3];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[1];
    tri_nodes[2] = qua_nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
  } else { /* 3-1 diag split of quad */
           /* 2-1
              |/|
              3-0 */
    tri_nodes[0] = qua_nodes[0];
    tri_nodes[1] = qua_nodes[1];
    tri_nodes[2] = qua_nodes[3];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
    tri_nodes[0] = qua_nodes[2];
    tri_nodes[1] = qua_nodes[3];
    tri_nodes[2] = qua_nodes[1];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tri_nodes), "a tri");
  }
  return REF_SUCCESS;
}